

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_null_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  sexp key;
  sexp psVar1;
  sexp in_RDI;
  sexp_sint_t in_stack_00000008;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp core;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp e;
  sexp_uint_t i;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  sexp self_00;
  sexp ctx_00;
  undefined8 env;
  undefined8 ctx_01;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_8;
  
  local_30 = 0x43e;
  local_8 = in_RDI;
  memset(&stack0xffffffffffffffc0,0,0x10);
  memset(&stack0xffffffffffffffa8,0,0x10);
  env = &stack0xffffffffffffffd0;
  ctx_01 = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  self_00 = (sexp)&stack0xffffffffffffffb8;
  ctx_00 = (sexp)(((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa8;
  local_30 = sexp_make_env_op(ctx_00,self_00,in_stack_ffffffffffffffa0);
  for (local_28 = 0.0; (ulong)local_28 < (sexp)0xa; local_28 = (long)&((sexp)local_28)->tag + 1) {
    key = sexp_copy_core((sexp)in_stack_ffffffffffffffa0,
                         (sexp_core_form_struct *)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 = local_8;
    in_stack_ffffffffffffffa0 = local_30;
    sexp_intern((sexp)__sexp_gc_preserver2.next,(char *)__sexp_gc_preserver2.var,in_stack_00000008);
    sexp_env_define((sexp)ctx_01,(sexp)env,key,ctx_00);
    psVar1 = sexp_c_string(key,(char *)ctx_00,(sexp_sint_t)self_00);
    (key->value).type.cpl = psVar1;
  }
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)ctx_01;
  return (sexp)local_30;
}

Assistant:

sexp sexp_make_null_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  sexp_uint_t i;
  sexp_gc_var2(e, core);
  sexp_gc_preserve2(ctx, e, core);
  e = sexp_make_env(ctx);
  for (i=0; i<(sizeof(core_forms)/sizeof(core_forms[0])); i++) {
    core = sexp_copy_core(ctx, &core_forms[i]);
    sexp_env_define(ctx, e, sexp_intern(ctx, (char*)sexp_core_name(core), -1), core);
    sexp_core_name(core) = sexp_c_string(ctx, (char*)sexp_core_name(core), -1);
  }
  sexp_gc_release2(ctx);
  return e;
}